

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall Lexer::lexLine(Lexer *this)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  Token local_b0;
  Token local_70;
  undefined1 local_40 [8];
  Token token;
  Lexer *this_local;
  
  token._40_8_ = this;
  while( true ) {
    iVar1 = this->_currentColumnNo;
    lVar2 = std::__cxx11::string::size();
    if (iVar1 == lVar2) {
      return;
    }
    iVar1 = this->_currentColumnNo;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= (ulong)(long)iVar1) break;
    Token::Token((Token *)local_40,NullToken);
    do {
      readToken(&local_70,this);
      Token::operator=((Token *)local_40,&local_70);
      Token::~Token(&local_70);
      Token::Token(&local_b0,(Token *)local_40);
      emitToken(this,&local_b0);
      Token::~Token(&local_b0);
    } while (local_40._0_4_ != LineTerminatorToken);
    Token::~Token((Token *)local_40);
  }
  __assert_fail("_currentColumnNo < _currentLine.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cubuspl42[P]aghsm/Lexer.cpp"
                ,0xb9,"void Lexer::lexLine()");
}

Assistant:

void Lexer::lexLine() {
    while(_currentColumnNo != _currentLine.size()) {
        assert(_currentColumnNo < _currentLine.size());
        Token token{Token::NullToken};
        do {
            token = readToken();
            emitToken(token);
        } while(token.type != Token::LineTerminatorToken);
    }
}